

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O3

planck_unit_suite_t * cpp_wrapper4_getsuite_1(void)

{
  planck_unit_suite_t *suite;
  
  suite = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite,test_static_setup_all,"test_static_setup_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_insert_multiple_all,"test_static_insert_multiple_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_get_lots_all,"test_static_get_lots_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_get_nonexist_many_all,"test_static_get_nonexist_many_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  planck_unit_add_to_suite
            (suite,test_static_update_exist_in_many_all,"test_static_update_exist_in_many_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
            );
  return suite;
}

Assistant:

planck_unit_suite_t *
cpp_wrapper4_getsuite_1(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_setup_all);

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_insert_multiple_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_get_lots_all);

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_get_nonexist_many_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_static_update_exist_in_many_all);

	return suite;
}